

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstring.cpp
# Opt level: O2

void __thiscall TPZString::Append(TPZString *this,char *TailIncrement)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  
  sVar2 = Length(this);
  sVar3 = strlen(TailIncrement);
  uVar4 = (this->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.super_TPZVec<char>.
          fNElements;
  lVar5 = (long)(int)sVar2;
  if (uVar4 < sVar3 + lVar5 + 1) {
    (*(this->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.super_TPZVec<char>._vptr_TPZVec
      [3])(this);
    uVar4 = (this->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.super_TPZVec<char>.
            fNElements;
  }
  strncpy((this->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.super_TPZVec<char>.fStore +
          lVar5,TailIncrement,uVar4 - lVar5);
  pcVar1 = (this->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.super_TPZVec<char>.fStore;
  sVar2 = Length(this);
  pcVar1[sVar2] = '\0';
  return;
}

Assistant:

void TPZString::Append(const char * TailIncrement)
{
	int OldLength = Length();
	size_t len = strlen(TailIncrement);
	
	if (fNElements < OldLength + len + 1) Resize(OldLength + len + 1); // the 1 stands for the null char
	
	strncpy(fStore + OldLength, TailIncrement,fNElements-OldLength);
	fStore[Length()] = '\0'; // just to ensure the string contains a null character
}